

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

bool __thiscall
ON_BoundingBox::Includes(ON_BoundingBox *this,ON_BoundingBox *other,bool bProperSubSet)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  bool local_61;
  bool local_49;
  undefined1 local_40 [8];
  ON_Interval otherI;
  ON_Interval thisI;
  int i;
  bool proper;
  bool rc;
  bool bProperSubSet_local;
  ON_BoundingBox *other_local;
  ON_BoundingBox *this_local;
  
  thisI.m_t[1]._6_1_ = true;
  local_61 = false;
  thisI.m_t[1]._0_4_ = 0;
  while( true ) {
    local_49 = false;
    if (thisI.m_t[1]._0_4_ < 3) {
      local_49 = thisI.m_t[1]._6_1_;
    }
    if (local_49 == false) break;
    dVar2 = ON_3dPoint::operator[](&this->m_min,thisI.m_t[1]._0_4_);
    dVar3 = ON_3dPoint::operator[](&this->m_max,thisI.m_t[1]._0_4_);
    ON_Interval::ON_Interval((ON_Interval *)(otherI.m_t + 1),dVar2,dVar3);
    dVar2 = ON_3dPoint::operator[](&other->m_min,thisI.m_t[1]._0_4_);
    dVar3 = ON_3dPoint::operator[](&other->m_max,thisI.m_t[1]._0_4_);
    ON_Interval::ON_Interval((ON_Interval *)local_40,dVar2,dVar3);
    thisI.m_t[1]._6_1_ =
         ON_Interval::Includes((ON_Interval *)(otherI.m_t + 1),(ON_Interval *)local_40,false);
    if ((bProperSubSet) && (!local_61)) {
      dVar2 = ON_3dPoint::operator[](&other->m_min,thisI.m_t[1]._0_4_);
      dVar3 = ON_3dPoint::operator[](&this->m_min,thisI.m_t[1]._0_4_);
      local_61 = true;
      if (dVar2 <= dVar3) {
        dVar2 = ON_3dPoint::operator[](&other->m_max,thisI.m_t[1]._0_4_);
        dVar3 = ON_3dPoint::operator[](&this->m_max,thisI.m_t[1]._0_4_);
        local_61 = dVar2 < dVar3;
      }
    }
    thisI.m_t[1]._0_4_ = thisI.m_t[1]._0_4_ + 1;
  }
  if ((bProperSubSet) && (bVar1 = thisI.m_t[1]._6_1_ != false, thisI.m_t[1]._6_1_ = false, bVar1)) {
    thisI.m_t[1]._6_1_ = local_61;
  }
  return thisI.m_t[1]._6_1_;
}

Assistant:

bool ON_BoundingBox::Includes( 
    const ON_BoundingBox& other,
    bool bProperSubSet) const
{
	bool rc = true;
	bool proper = false;
	for(int i=0; i<3 && rc ; i++)
  {
		ON_Interval thisI( m_min[i], m_max[i]);
		ON_Interval otherI( other.m_min[i], other.m_max[i]);
		rc = thisI.Includes( otherI );
		if(bProperSubSet && !proper)
    {
			proper = (other.m_min[i] > m_min[i]) || (other.m_max[i] < m_max[i]);
    }
	}
  // 9 December 2004 Dale Lear
  //    fixed bug by changing if(proper) to if(bProperSubSet)
	if(bProperSubSet)
		rc = rc && proper;
	return rc;
}